

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

void __thiscall
tcu::anon_unknown_4::Test::testRound(Test *this,double arg,double refDown,double refUp)

{
  ostream *poVar1;
  FloatFormat *pFVar2;
  double dVar3;
  string local_368;
  ostringstream local_348 [8];
  ostringstream oss_1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream oss;
  double refUp_local;
  double refDown_local;
  double arg_local;
  Test *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"round(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,arg);
  std::operator<<(poVar1,", false)");
  std::__cxx11::ostringstream::str();
  pFVar2 = de::details::UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::
           operator->((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_> *)this);
  dVar3 = FloatFormat::round(pFVar2,arg);
  check(this,&local_1d0,dVar3,refDown);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::__cxx11::ostringstream::ostringstream(local_348);
  poVar1 = std::operator<<((ostream *)local_348,"round(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,arg);
  std::operator<<(poVar1,", true)");
  std::__cxx11::ostringstream::str();
  pFVar2 = de::details::UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::
           operator->((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_> *)this);
  dVar3 = FloatFormat::round(pFVar2,arg);
  check(this,&local_368,dVar3,refUp);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::ostringstream::~ostringstream(local_348);
  return;
}

Assistant:

void Test::testRound (double arg, double refDown, double refUp) const
{
	{
		ostringstream oss;
		oss << "round(" << arg << ", false)";
		check(oss.str(), m_fmt->round(arg, false), refDown);
	}
	{
		ostringstream oss;
		oss << "round(" << arg << ", true)";
		check(oss.str(), m_fmt->round(arg, true), refUp);
	}
}